

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkUifNodePairs(Wlc_Ntk_t *p,Vec_Int_t *vPairsInit)

{
  Wlc_Obj_t *pObj2;
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Vec_Int_t *__ptr;
  Vec_Int_t *vFanins;
  int *piVar8;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar9;
  ulong uVar10;
  Wlc_Ntk_t *pWVar11;
  long lVar12;
  long lVar13;
  Wlc_Obj_t *pWVar14;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar15;
  long lVar16;
  
  __ptr = vPairsInit;
  if ((vPairsInit == (Vec_Int_t *)0x0) &&
     (__ptr = Wlc_NtkFindUifableMultiplierPairs(p), __ptr == (Vec_Int_t *)0x0)) {
    return (Wlc_Ntk_t *)0x0;
  }
  uVar7 = __ptr->nSize;
  if (((int)uVar7 < 1) || ((uVar7 & 1) != 0)) {
    __assert_fail("Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                  ,0xfa,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar8 = (int *)malloc(400);
  vFanins->pArray = piVar8;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(400);
  p_00->pArray = piVar8;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar8 = (int *)malloc(400);
  p_01->pArray = piVar8;
  if (1 < uVar7) {
    lVar16 = 0;
    do {
      iVar6 = __ptr->pArray[lVar16];
      lVar12 = (long)iVar6;
      if ((lVar12 < 1) || (p->nObjsAlloc <= iVar6)) goto LAB_0037c761;
      uVar7 = __ptr->pArray[lVar16 + 1];
      if (((int)uVar7 < 1) || ((uint)p->nObjsAlloc <= uVar7)) goto LAB_0037c761;
      pWVar14 = p->pObjs + lVar12;
      pObj2 = p->pObjs + uVar7;
      iVar5 = Wlc_NtkPairIsUifable(p,pWVar14,pObj2);
      if (iVar5 == 0) {
        __assert_fail("Wlc_NtkPairIsUifable(p, pObj, pObj2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x104,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      p_00->nSize = 0;
      uVar10 = (ulong)pWVar14->nFanins;
      if ((int)pWVar14->nFanins < 1) {
        iVar5 = -1;
      }
      else {
        lVar13 = 0;
        do {
          if (((uint)uVar10 < 3) && ((*(uint *)pWVar14 & 0x3f | 0x10) != 0x16)) {
            paVar15 = &pWVar14->field_10;
          }
          else {
            paVar15 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar14->field_10).pFanins[0];
          }
          if ((2 < pObj2->nFanins) ||
             (paVar9 = &pObj2->field_10, (*(uint *)pObj2 & 0x3f | 0x10) == 0x16)) {
            paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj2->field_10).pFanins[0];
          }
          iVar5 = paVar15->Fanins[lVar13];
          iVar2 = paVar9->Fanins[lVar13];
          piVar8 = vFanins->pArray;
          if (vFanins->nCap < 2) {
            if (piVar8 == (int *)0x0) {
              piVar8 = (int *)malloc(8);
            }
            else {
              piVar8 = (int *)realloc(piVar8,8);
            }
            vFanins->pArray = piVar8;
            if (piVar8 == (int *)0x0) goto LAB_0037c780;
            vFanins->nCap = 2;
          }
          *piVar8 = iVar5;
          piVar8[1] = iVar2;
          vFanins->nSize = 2;
          iVar5 = Wlc_ObjCreate(p,0x20,0,0,0,vFanins);
          Vec_IntPush(p_00,iVar5);
          if (p->nObjsAlloc <= iVar6) goto LAB_0037c761;
          pWVar14 = p->pObjs + lVar12;
          lVar13 = lVar13 + 1;
          uVar10 = (ulong)(int)pWVar14->nFanins;
        } while (lVar13 < (long)uVar10);
        iVar5 = p_00->nSize + -1;
      }
      iVar5 = Wlc_ObjCreate(p,0x17,0,iVar5,0,p_00);
      piVar8 = vFanins->pArray;
      if (vFanins->nCap < 1) {
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc(4);
        }
        else {
          piVar8 = (int *)realloc(piVar8,4);
        }
        vFanins->pArray = piVar8;
        if (piVar8 == (int *)0x0) goto LAB_0037c780;
        vFanins->nCap = 1;
      }
      *piVar8 = iVar5;
      vFanins->nSize = 1;
      iVar5 = Wlc_ObjCreate(p,0x26,0,0,0,vFanins);
      piVar8 = vFanins->pArray;
      if (vFanins->nCap < 2) {
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc(8);
        }
        else {
          piVar8 = (int *)realloc(piVar8,8);
        }
        vFanins->pArray = piVar8;
        if (piVar8 == (int *)0x0) goto LAB_0037c780;
        vFanins->nCap = 2;
      }
      *piVar8 = iVar6;
      piVar8[1] = uVar7;
      vFanins->nSize = 2;
      iVar6 = Wlc_ObjCreate(p,0x1f,0,0,0,vFanins);
      piVar8 = vFanins->pArray;
      if (vFanins->nCap < 2) {
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc(8);
        }
        else {
          piVar8 = (int *)realloc(piVar8,8);
        }
        vFanins->pArray = piVar8;
        if (piVar8 == (int *)0x0) goto LAB_0037c780;
        vFanins->nCap = 2;
      }
      *piVar8 = iVar5;
      piVar8[1] = iVar6;
      vFanins->nSize = 2;
      iVar6 = Wlc_ObjCreate(p,0x1d,0,0,0,vFanins);
      Vec_IntPush(p_01,iVar6);
      lVar16 = lVar16 + 2;
    } while ((int)((uint)lVar16 | 1) < __ptr->nSize);
    iVar6 = p_01->nSize;
    if (0 < iVar6) {
      if (iVar6 == 1) {
        uVar7 = *p_01->pArray;
      }
      else {
        iVar6 = Wlc_ObjCreate(p,0x17,0,iVar6 + -1,0,p_01);
        piVar8 = vFanins->pArray;
        if (vFanins->nCap < 1) {
          if (piVar8 == (int *)0x0) {
            piVar8 = (int *)malloc(4);
          }
          else {
            piVar8 = (int *)realloc(piVar8,4);
          }
          vFanins->pArray = piVar8;
          if (piVar8 == (int *)0x0) {
LAB_0037c780:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vFanins->nCap = 1;
        }
        *piVar8 = iVar6;
        vFanins->nSize = 1;
        uVar7 = Wlc_ObjCreate(p,0x25,0,0,0,vFanins);
      }
      if (0 < (p->vPos).nSize) {
        lVar16 = 0;
        do {
          iVar6 = (p->vPos).pArray[lVar16];
          if (((long)iVar6 < 1) || (p->nObjsAlloc <= iVar6)) {
LAB_0037c761:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          piVar8 = vFanins->pArray;
          if (vFanins->nCap < 2) {
            if (piVar8 == (int *)0x0) {
              piVar8 = (int *)malloc(8);
            }
            else {
              piVar8 = (int *)realloc(piVar8,8);
            }
            vFanins->pArray = piVar8;
            if (piVar8 == (int *)0x0) goto LAB_0037c780;
            vFanins->nCap = 2;
          }
          *piVar8 = iVar6;
          piVar8[1] = uVar7;
          vFanins->nSize = 2;
          uVar7 = Wlc_ObjCreate(p,0x1c,0,0,0,vFanins);
          if (p->nObjsAlloc <= iVar6) goto LAB_0037c761;
          if ((p->vPos).nSize <= lVar16) {
LAB_0037c79f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar8 = (p->vPos).pArray;
          if (piVar8[lVar16] != iVar6) {
            __assert_fail("Vec_IntEntry(&p->vPos, i) == iObj",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                          ,0x135,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
          }
          if ((p->vCos).nSize <= lVar16) goto LAB_0037c79f;
          piVar4 = (p->vCos).pArray;
          if (piVar4[lVar16] != iVar6) {
            __assert_fail("Vec_IntEntry(&p->vCos, i) == iObj",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                          ,0x136,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
          }
          pWVar14 = p->pObjs;
          piVar8[lVar16] = uVar7;
          if ((p->vCos).nSize <= lVar16) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar4[lVar16] = uVar7;
          if (((int)uVar7 < 1) || (p->nObjsAlloc <= (int)uVar7)) goto LAB_0037c761;
          puVar1 = &pWVar14[uVar7].field_0x1;
          *puVar1 = *puVar1 | 2;
          pWVar14 = pWVar14 + iVar6;
          uVar3 = *(uint *)pWVar14;
          if ((uVar3 >> 9 & 1) == 0) {
            __assert_fail("pObj->fIsPo",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                          ,0x13b,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
          }
          *(ushort *)pWVar14 = (ushort)uVar3 & 0xfdff;
          lVar16 = lVar16 + 1;
        } while (lVar16 < (p->vPos).nSize);
      }
      if (p_01->pArray != (int *)0x0) {
        free(p_01->pArray);
      }
      free(p_01);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      if (vFanins->pArray != (int *)0x0) {
        free(vFanins->pArray);
      }
      free(vFanins);
      if (__ptr != vPairsInit) {
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
      }
      pWVar11 = Wlc_NtkDupDfs(p,0,1);
      return pWVar11;
    }
  }
  __assert_fail("Vec_IntSize(vUifConstrs) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                ,0x120,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
}

Assistant:

Wlc_Ntk_t * Wlc_NtkUifNodePairs( Wlc_Ntk_t * p, Vec_Int_t * vPairsInit )
{
    Vec_Int_t * vPairs = vPairsInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObj2;
    Vec_Int_t * vUifConstrs, * vCompares, * vFanins;
    int i, k, iObj, iObj2, iObjNew, iObjNew2;
    int iFanin, iFanin2, iFaninNew;
    // get multiplier pairs if not given
    if ( vPairs == NULL )
        vPairs = Wlc_NtkFindUifableMultiplierPairs( p );
    if ( vPairs == NULL )
        return NULL;
    // sanity checks
    assert( Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0 );
    // iterate through node pairs
    vFanins = Vec_IntAlloc( 100 );
    vCompares = Vec_IntAlloc( 100 );
    vUifConstrs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, iObj2, i )
    {
        // get two nodes
        pObj  = Wlc_NtkObj( p, iObj );
        pObj2 = Wlc_NtkObj( p, iObj2 );
        assert( Wlc_NtkPairIsUifable(p, pObj, pObj2) );
        // create fanin comparator nodes
        Vec_IntClear( vCompares );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            iFanin2 = Wlc_ObjFaninId( pObj2, k );
            Vec_IntFillTwo( vFanins, 2, iFanin, iFanin2 );
            iFaninNew = Wlc_ObjCreate( p, WLC_OBJ_COMP_NOTEQU, 0, 0, 0, vFanins );
            Vec_IntPush( vCompares, iFaninNew );
            // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
            // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
            pObj = Wlc_NtkObj( p, iObj );
        }
        // concatenate fanin comparators
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vCompares) - 1, 0, vCompares );
        // create reduction-OR node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_OR, 0, 0, 0, vFanins );
        // craete output comparator node
        Vec_IntFillTwo( vFanins, 2, iObj, iObj2 );
        iObjNew2 = Wlc_ObjCreate( p, WLC_OBJ_COMP_EQU, 0, 0, 0, vFanins );
        // create implication node (iObjNew is already complemented above)
        Vec_IntFillTwo( vFanins, 2, iObjNew, iObjNew2 );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_OR, 0, 0, 0, vFanins );
        // save the constraint
        Vec_IntPush( vUifConstrs, iObjNew );
    }
    // derive the AND of the UIF contraints
    assert( Vec_IntSize(vUifConstrs) > 0 );
    if ( Vec_IntSize(vUifConstrs) == 1 )
        iObjNew = Vec_IntEntry( vUifConstrs, 0 );
    else
    {
        // concatenate
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vUifConstrs) - 1, 0, vUifConstrs );
        // create reduction-AND node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_AND, 0, 0, 0, vFanins );
    }
    // update each PO to point to the new node
    Wlc_NtkForEachPo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Vec_IntFillTwo( vFanins, 2, iObj, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_AND, 0, 0, 0, vFanins );
        // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
        // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
        pObj = Wlc_NtkObj( p, iObj );
        // update PO/CO arrays
        assert( Vec_IntEntry(&p->vPos, i) == iObj );
        assert( Vec_IntEntry(&p->vCos, i) == iObj );
        Vec_IntWriteEntry( &p->vPos, i, iObjNew );
        Vec_IntWriteEntry( &p->vCos, i, iObjNew );
        // transfer the PO attribute
        Wlc_NtkObj(p, iObjNew)->fIsPo = 1;
        assert( pObj->fIsPo );
        pObj->fIsPo = 0;
    }
    // cleanup
    Vec_IntFree( vUifConstrs );
    Vec_IntFree( vCompares );
    Vec_IntFree( vFanins );
    if ( vPairs != vPairsInit )
        Vec_IntFree( vPairs );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}